

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer,UseMemoization useMemoization)

{
  int iVar1;
  long lVar2;
  Printer *this_00;
  bool bVar3;
  JavaType JVar4;
  Descriptor *pDVar5;
  ulong uVar6;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar7;
  Descriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  long lVar8;
  char *__s;
  long lVar9;
  allocator<char> local_c9;
  Printer *local_c8;
  UseMemoization local_bc;
  char *local_b8;
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  local_b0;
  long local_80;
  FieldDescriptor *local_78;
  string local_70;
  string local_50;
  
  local_c8 = printer;
  local_bc = useMemoization;
  if (useMemoization == MEMOIZE) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized != -1) return isInitialized == 1;\n\n"
                      );
    __s = "memoizedIsInitialized = 0;";
    pFVar7 = extraout_RDX_00;
  }
  else {
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
    __s = "";
    pFVar7 = extraout_RDX;
  }
  lVar9 = 0;
  lVar8 = 0;
  while( true ) {
    pDVar5 = this->descriptor_;
    uVar6 = (ulong)*(int *)(pDVar5 + 0x2c);
    if ((long)uVar6 <= lVar8) break;
    if (*(int *)(*(long *)(pDVar5 + 0x30) + 0x30 + lVar9) == 2) {
      UnderscoresToCapitalizedCamelCase_abi_cxx11_
                ((string *)&local_b0,(java *)(*(long *)(pDVar5 + 0x30) + lVar9),pFVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,__s,(allocator<char> *)&local_70);
      io::Printer::Print(local_c8,"if (!has$name$()) {\n  $memoize$\n  return false;\n}\n","name",
                         (string *)&local_b0,"memoize",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      pFVar7 = extraout_RDX_01;
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x78;
  }
  local_b8 = "";
  if (local_bc == MEMOIZE) {
    local_b8 = "memoizedIsInitialized = 0;";
  }
  lVar9 = 0;
  lVar8 = 0;
  do {
    this_00 = local_c8;
    if ((int)uVar6 <= lVar8) {
      if (0 < *(int *)(pDVar5 + 0x58)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,local_b8,(allocator<char> *)&local_50);
        io::Printer::Print(this_00,
                           "if (!extensionsAreInitialized()) {\n  $memoize$\n  return false;\n}\n",
                           "memoize",(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      io::Printer::Outdent(this_00);
      if (local_bc == MEMOIZE) {
        io::Printer::Print(this_00,"  memoizedIsInitialized = 1;\n");
      }
      io::Printer::Print(this_00,"  return true;\n}\n\n");
      return;
    }
    lVar2 = *(long *)(pDVar5 + 0x30);
    JVar4 = GetJavaType((FieldDescriptor *)(lVar9 + lVar2));
    if (JVar4 == JAVATYPE_MESSAGE) {
      pDVar5 = *(Descriptor **)(lVar2 + 0x48 + lVar9);
      local_80 = lVar8;
      local_78 = (FieldDescriptor *)(lVar9 + lVar2);
      hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
      ::hash_set((hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                  *)&local_b0,0);
      bVar3 = anon_unknown_5::HasRequiredFields
                        (pDVar5,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                 *)&local_b0);
      std::tr1::
      _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
      ::~_Hashtable(&local_b0);
      pFVar7 = local_78;
      lVar8 = local_80;
      if (bVar3) {
        iVar1 = *(int *)(lVar2 + 0x30 + lVar9);
        if (iVar1 == 1) {
          ClassName_abi_cxx11_((string *)&local_b0,*(java **)(lVar2 + 0x48 + lVar9),descriptor);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_50,(java *)pFVar7,field_01);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_b8,&local_c9)
          ;
          io::Printer::Print(local_c8,
                             "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                             ,"type",(string *)&local_b0,"name",&local_50,"memoize",&local_70);
        }
        else if (iVar1 == 3) {
          ClassName_abi_cxx11_((string *)&local_b0,*(java **)(lVar2 + 0x48 + lVar9),descriptor);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_50,(java *)pFVar7,field_00);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_b8,&local_c9)
          ;
          io::Printer::Print(local_c8,
                             "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                             ,"type",(string *)&local_b0,"name",&local_50,"memoize",&local_70);
        }
        else {
          if (iVar1 != 2) goto LAB_001c0c80;
          ClassName_abi_cxx11_((string *)&local_b0,*(java **)(lVar2 + 0x48 + lVar9),descriptor);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_50,(java *)pFVar7,field);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_b8,&local_c9)
          ;
          io::Printer::Print(local_c8,
                             "if (!get$name$().isInitialized()) {\n  $memoize$\n  return false;\n}\n"
                             ,"type",(string *)&local_b0,"name",&local_50,"memoize",&local_70);
        }
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
LAB_001c0c80:
    lVar8 = lVar8 + 1;
    pDVar5 = this->descriptor_;
    uVar6 = (ulong)*(uint *)(pDVar5 + 0x2c);
    lVar9 = lVar9 + 0x78;
  } while( true );
}

Assistant:

void MessageGenerator::GenerateIsInitialized(
    io::Printer* printer, UseMemoization useMemoization) {
  bool memoization = useMemoization == MEMOIZE;
  if (memoization) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  if (memoization) {
    printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized != -1) return isInitialized == 1;\n"
      "\n");
  }

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  $memoize$\n"
        "  return false;\n"
        "}\n",
        "name", UnderscoresToCapitalizedCamelCase(field),
        "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  $memoize$\n"
             "  return false;\n"
             "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_REPEATED:
          printer->Print(
            "for (int i = 0; i < get$name$Count(); i++) {\n"
            "  if (!get$name$(i).isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  $memoize$\n"
      "  return false;\n"
      "}\n",
      "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
  }

  printer->Outdent();

  if (memoization) {
    printer->Print(
      "  memoizedIsInitialized = 1;\n");
  }

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}